

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O2

void __thiscall FIX::Initiator::~Initiator(Initiator *this)

{
  _Base_ptr p_Var1;
  
  this->_vptr_Initiator = (_func_int **)&PTR__Initiator_001ef458;
  for (p_Var1 = (this->m_sessions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->m_sessions)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    if (p_Var1[0xc]._M_parent != (_Base_ptr)0x0) {
      (**(code **)(*(long *)p_Var1[0xc]._M_parent + 8))();
    }
  }
  if ((this->m_pLogFactory != (LogFactory *)0x0) && (this->m_pLog != (Log *)0x0)) {
    (**(code **)(*(long *)this->m_pLogFactory + 0x20))();
  }
  pthread_mutex_destroy((pthread_mutex_t *)&this->m_mutex);
  SessionSettings::~SessionSettings(&this->m_settings);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_int>,_std::_Select1st<std::pair<const_FIX::SessionID,_int>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_int>_>_>
  ::~_Rb_tree(&(this->m_sessionState)._M_t);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&(this->m_disconnected)._M_t);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&(this->m_connected)._M_t);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&(this->m_pending)._M_t);
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&(this->m_sessionIDs)._M_t);
  std::
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Session_*>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Session_*>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Session_*>_>_>
  ::~_Rb_tree(&(this->m_sessions)._M_t);
  return;
}

Assistant:

Initiator::~Initiator()
{
  Sessions::iterator i;
  for ( i = m_sessions.begin(); i != m_sessions.end(); ++i )
    delete i->second;

  if( m_pLogFactory && m_pLog )
    m_pLogFactory->destroy( m_pLog );
}